

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_HasProperty(JSContext *ctx,JSValue obj,JSAtom prop)

{
  JSClassExoticMethods *pJVar1;
  _func_int_JSContext_ptr_JSValue_JSAtom *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int unaff_EBP;
  JSValueUnion p_00;
  JSRefCountHeader *p;
  JSValue JVar6;
  JSValue v;
  JSValue v_00;
  
  p_00 = obj.u;
  if ((int)obj.tag == -1) {
    do {
      if ((*(byte *)((long)p_00.ptr + 5) & 4) != 0) {
        pJVar1 = ctx->rt->class_array[*(ushort *)((long)p_00.ptr + 6)].exotic;
        bVar3 = true;
        if ((pJVar1 != (JSClassExoticMethods *)0x0) &&
           (p_Var2 = pJVar1->has_property, p_Var2 != (_func_int_JSContext_ptr_JSValue_JSAtom *)0x0))
        {
          *(int *)p_00.ptr = *p_00.ptr + 1;
          JVar6.tag = -1;
          JVar6.u.ptr = p_00.ptr;
          unaff_EBP = (*p_Var2)(ctx,JVar6,prop);
          iVar5 = *p_00.ptr;
          *(int *)p_00.ptr = iVar5 + -1;
          if (iVar5 < 2) {
            v.tag = -1;
            v.u.ptr = p_00.ptr;
            __JS_FreeValueRT(ctx->rt,v);
          }
          bVar3 = false;
        }
        if (!bVar3) {
          return unaff_EBP;
        }
      }
      *(int *)p_00.ptr = *p_00.ptr + 1;
      iVar4 = JS_GetOwnPropertyInternal(ctx,(JSPropertyDescriptor *)0x0,(JSObject *)p_00.ptr,prop);
      iVar5 = *p_00.ptr;
      *(int *)p_00.ptr = iVar5 + -1;
      if (iVar5 < 2) {
        v_00.tag = -1;
        v_00.u.ptr = p_00.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
      if (iVar4 != 0) {
        return iVar4;
      }
      if (((ushort)(*(short *)((long)p_00.ptr + 6) - 0x15U) < 9) &&
         (iVar5 = JS_AtomIsNumericIndex(ctx,prop), iVar5 != 0)) {
        return iVar5 >> 0x1f;
      }
      p_00 = (JSValueUnion)(*(JSShape **)((long)p_00.ptr + 0x18))->proto;
    } while ((JSObject *)p_00.ptr != (JSObject *)0x0);
  }
  return 0;
}

Assistant:

int JS_HasProperty(JSContext *ctx, JSValueConst obj, JSAtom prop)
{
    JSObject *p;
    int ret;
    JSValue obj1;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    for(;;) {
        if (p->is_exotic) {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->has_property) {
                /* has_property can free the prototype */
                obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
                ret = em->has_property(ctx, obj1, prop);
                JS_FreeValue(ctx, obj1);
                return ret;
            }
        }
        /* JS_GetOwnPropertyInternal can free the prototype */
        JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        ret = JS_GetOwnPropertyInternal(ctx, NULL, p, prop);
        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        if (ret != 0)
            return ret;
        if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
            p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            ret = JS_AtomIsNumericIndex(ctx, prop);
            if (ret != 0) {
                if (ret < 0)
                    return -1;
                return FALSE;
            }
        }
        p = p->shape->proto;
        if (!p)
            break;
    }
    return FALSE;
}